

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read_sharedstrings.c
# Opt level: O2

void shared_strings_callback_skip_tag_end(void *callbackdata,XML_Char *name)

{
  long *plVar1;
  int iVar2;
  
  if ((name != (XML_Char *)0x0) &&
     (iVar2 = strcasecmp(name,*(char **)((long)callbackdata + 0x30)), iVar2 != 0)) {
    return;
  }
  plVar1 = (long *)((long)callbackdata + 0x38);
  *plVar1 = *plVar1 + -1;
  if (*plVar1 == 0) {
    XML_SetElementHandler
              (*callbackdata,*(undefined8 *)((long)callbackdata + 0x40),
               *(undefined8 *)((long)callbackdata + 0x48));
    XML_SetCharacterDataHandler(*callbackdata,*(undefined8 *)((long)callbackdata + 0x50));
    free(*(void **)((long)callbackdata + 0x30));
    *(undefined8 *)((long)callbackdata + 0x30) = 0;
  }
  return;
}

Assistant:

void shared_strings_callback_skip_tag_end (void* callbackdata, const XML_Char* name)
{
  struct shared_strings_callback_data* data = (struct shared_strings_callback_data*)callbackdata;
  if (!name || XML_Char_icmp(name, data->skiptag) == 0) {
    if (--data->skiptagcount == 0) {
      //restore handlers when done skipping
      XML_SetElementHandler(data->xmlparser, data->skip_start, data->skip_end);
      XML_SetCharacterDataHandler(data->xmlparser, data->skip_data);
      free(data->skiptag);
      data->skiptag = NULL;
    }
  }
}